

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O3

string * __thiscall
re2c::InputAPI::stmt_skip_peek_abi_cxx11_
          (string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  long lVar1;
  undefined8 *puVar2;
  opt_t *poVar3;
  long *plVar4;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  int iVar8;
  undefined8 uVar9;
  ulong uVar10;
  _Alloc_hider _Var11;
  string str;
  string local_110;
  string local_f0;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  undefined8 local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  if (this->type_ == DEFAULT) {
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    iVar8 = ind + 1;
    local_70 = &local_60;
    while ((poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868), poVar3->target != DOT &&
           (iVar8 = iVar8 + -1, iVar8 != 0))) {
      poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)(poVar3->indString)._M_dataplus._M_p)
      ;
    }
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)(poVar3->yych)._M_dataplus._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_40 = *plVar5;
      lStack_38 = plVar4[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar5;
      local_50 = (long *)*plVar4;
    }
    local_48 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_a0 = *puVar6;
      lStack_98 = plVar4[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *puVar6;
      local_b0 = (ulong *)*plVar4;
    }
    local_a8 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Opt::yychConversion_abi_cxx11_(&local_90,(Opt *)&opts);
    uVar10 = 0xf;
    if (local_b0 != &local_a0) {
      uVar10 = local_a0;
    }
    if (uVar10 < local_90._M_string_length + local_a8) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar9 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_90._M_string_length + local_a8) goto LAB_00121d67;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
    }
    else {
LAB_00121d67:
      puVar2 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
    }
    local_d0 = &local_c0;
    plVar4 = puVar2 + 2;
    if ((long *)*puVar2 == plVar4) {
      local_c0 = *plVar4;
      uStack_b8 = puVar2[3];
    }
    else {
      local_c0 = *plVar4;
      local_d0 = (long *)*puVar2;
    }
    local_c8 = puVar2[1];
    *puVar2 = plVar4;
    puVar2[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_110.field_2._M_allocated_capacity = *puVar6;
      local_110.field_2._8_8_ = plVar4[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *puVar6;
      local_110._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_110._M_string_length = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)(poVar3->yycursor)._M_dataplus._M_p);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_f0.field_2._M_allocated_capacity = *puVar6;
      local_f0.field_2._8_8_ = plVar4[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *puVar6;
      local_f0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_f0._M_string_length = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar7) {
      lVar1 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_70 == &local_60) {
      return __return_storage_ptr__;
    }
    uVar9 = CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]);
    _Var11._M_p = (pointer)local_70;
    goto LAB_00121f94;
  }
  stmt_skip_abi_cxx11_(&local_f0,this,ind);
  stmt_peek_abi_cxx11_(&local_110,this,ind);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    uVar9 = local_f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_110._M_string_length + local_f0._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar9 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_110._M_string_length + local_f0._M_string_length) goto LAB_00121b33;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_110,0,(char *)0x0,(ulong)local_f0._M_dataplus._M_p);
  }
  else {
LAB_00121b33:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110._M_dataplus._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar7) {
    uVar9 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar9;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar7;
  puVar2[1] = 0;
  *(undefined1 *)psVar7 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  uVar9 = local_f0.field_2._M_allocated_capacity;
  _Var11._M_p = local_f0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
    return __return_storage_ptr__;
  }
LAB_00121f94:
  operator_delete(_Var11._M_p,uVar9 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_skip_peek (uint32_t ind) const
{
	return type_ == DEFAULT
		? indent (ind) + opts->yych + " = " + opts.yychConversion () + "*++" + opts->yycursor + ";\n"
		: stmt_skip (ind) + stmt_peek (ind);
}